

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

PropertyRecord * __thiscall
ThreadContext::FindPropertyRecord(ThreadContext *this,char16 *propertyName,int propertyNameLength)

{
  BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
  *pBVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  PropertyRecord *pPVar5;
  long *plVar6;
  undefined8 *puVar7;
  undefined4 *puVar8;
  HashedCharacterBuffer<char16_t> local_30;
  
  if (propertyNameLength < 2) {
    if (propertyNameLength == 1) {
      if ((ushort)*propertyName < 0x80) {
        pPVar5 = this->propertyNamesDirect[(ushort)*propertyName];
        pBVar1 = (BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
                  *)this->propertyMap;
        Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer(&local_30,propertyName,1);
        uVar4 = JsUtil::
                BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
                ::FindEntryWithKey<Js::HashedCharacterBuffer<char16_t>>(pBVar1,&local_30);
        if ((int)uVar4 < 0) {
          plVar6 = &JsUtil::
                    BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
                    ::
                    LookupWithKey<Js::HashedCharacterBuffer<char16_t>>(Js::HashedCharacterBuffer<char16_t>const&)
                    ::nullElement;
        }
        else {
          plVar6 = (long *)((ulong)uVar4 * 0x10 + *(long *)(pBVar1 + 0x48));
        }
        if (pPVar5 == (PropertyRecord *)*plVar6) {
          return pPVar5;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                           ,0x381,
                           "(propertyRecord == propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength)))"
                           ,
                           "propertyRecord == propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength))"
                          );
        if (bVar3) {
          *puVar8 = 0;
          return pPVar5;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    else if (propertyNameLength == 0) {
      pPVar5 = GetEmptyStringPropertyRecord(this);
      return pPVar5;
    }
  }
  pBVar1 = (BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
            *)this->propertyMap;
  Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
            (&local_30,propertyName,propertyNameLength);
  uVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
          ::FindEntryWithKey<Js::HashedCharacterBuffer<char16_t>>(pBVar1,&local_30);
  if ((int)uVar4 < 0) {
    puVar7 = &JsUtil::
              BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
              ::
              LookupWithKey<Js::HashedCharacterBuffer<char16_t>>(Js::HashedCharacterBuffer<char16_t>const&)
              ::nullElement;
  }
  else {
    puVar7 = (undefined8 *)((ulong)uVar4 * 0x10 + *(long *)(pBVar1 + 0x48));
  }
  return (PropertyRecord *)*puVar7;
}

Assistant:

const Js::PropertyRecord *
ThreadContext::FindPropertyRecord(const char16 * propertyName, int propertyNameLength)
{
    // IsDirectPropertyName == 1 char properties && GetEmptyStringPropertyRecord == 0 length
    if (propertyNameLength < 2)
    {
        if (propertyNameLength == 0)
        {
            return this->GetEmptyStringPropertyRecord();
        }

    if (IsDirectPropertyName(propertyName, propertyNameLength))
    {
            Js::PropertyRecord const * propertyRecord = propertyNamesDirect[propertyName[0]];
        Assert(propertyRecord == propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength)));
            return propertyRecord;
    }
    }

    return propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength));
}